

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-semaphore.c
# Opt level: O0

int run_test_semaphore_1(void)

{
  int iVar1;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  worker_config_conflict1 wc;
  uv_thread_t thread;
  
  memset(&eval_a,0,0x50);
  iVar1 = uv_sem_init((uv_sem_t *)((long)&wc.mutex + 0x20),0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-semaphore.c"
            ,0x38,"uv_sem_init(&wc.sem, 0)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_mutex_init((uv_mutex_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-semaphore.c"
            ,0x39,"uv_mutex_init(&wc.mutex)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_thread_create((uv_thread_t *)&wc.delay,worker,&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-semaphore.c"
            ,0x3a,"uv_thread_create(&thread, worker, &wc)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_sleep(100);
  uv_mutex_lock((uv_mutex_t *)&eval_a);
  if (SEXT48(wc.sem._28_4_) != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-semaphore.c"
            ,0x3e,"1","==","wc.posted",1,"==",SEXT48(wc.sem._28_4_));
    abort();
  }
  uv_sem_wait((uv_sem_t *)((long)&wc.mutex + 0x20));
  uv_mutex_unlock((uv_mutex_t *)&eval_a);
  iVar1 = uv_thread_join((uv_thread_t *)&wc.delay);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-semaphore.c"
            ,0x42,"uv_thread_join(&thread)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_mutex_destroy((uv_mutex_t *)&eval_a);
  uv_sem_destroy((uv_sem_t *)((long)&wc.mutex + 0x20));
  return 0;
}

Assistant:

TEST_IMPL(semaphore_1) {
  uv_thread_t thread;
  worker_config wc;

  memset(&wc, 0, sizeof(wc));

  ASSERT_OK(uv_sem_init(&wc.sem, 0));
  ASSERT_OK(uv_mutex_init(&wc.mutex));
  ASSERT_OK(uv_thread_create(&thread, worker, &wc));

  uv_sleep(100);
  uv_mutex_lock(&wc.mutex);
  ASSERT_EQ(1, wc.posted);
  uv_sem_wait(&wc.sem); /* should not block */
  uv_mutex_unlock(&wc.mutex); /* ergo, it should be ok to unlock after wait */

  ASSERT_OK(uv_thread_join(&thread));
  uv_mutex_destroy(&wc.mutex);
  uv_sem_destroy(&wc.sem);

  return 0;
}